

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::SectionTracker::tryOpen(SectionTracker *this)

{
  bool bVar1;
  __type _Var2;
  uint uVar3;
  reference __lhs;
  int extraout_EDX;
  int extraout_EDX_00;
  int __oflag;
  NameAndLocation *in_RSI;
  undefined1 auVar4 [12];
  SectionTracker *this_local;
  
  uVar3 = (*(this->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
            super_NonCopyable._vptr_NonCopyable[5])();
  if ((uVar3 & 1) == 0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->m_filters);
    __oflag = extraout_EDX;
    if (!bVar1) {
      in_RSI = (NameAndLocation *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->m_filters,0);
      auVar4 = std::__cxx11::string::empty();
      __oflag = auVar4._8_4_;
      if ((auVar4 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        __lhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->m_filters,0);
        in_RSI = &(this->super_TrackerBase).m_nameAndLocation;
        _Var2 = std::operator==(__lhs,&in_RSI->name);
        __oflag = extraout_EDX_00;
        if (!_Var2) {
          return;
        }
      }
    }
    TrackerBase::open(&this->super_TrackerBase,(char *)in_RSI,__oflag);
  }
  return;
}

Assistant:

void tryOpen() {
            if( !isComplete() && (m_filters.empty() || m_filters[0].empty() ||  m_filters[0] == m_nameAndLocation.name ) )
                open();
        }